

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void ImGui::SFML::Update(Vector2i *mousePos,Vector2f *displaySize,Time dt)

{
  ImVec2 IVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  ImGuiIO *io;
  uint i;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Time dt_local;
  Vector2i local_28;
  
  dt_local = dt;
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx && \"No current window is set - forgot to call ImGui::SFML::Init?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x1c3,
                  "void ImGui::SFML::Update(const sf::Vector2i &, const sf::Vector2f &, sf::Time)");
  }
  io = GetIO();
  fVar6 = displaySize->y;
  (io->DisplaySize).x = displaySize->x;
  (io->DisplaySize).y = fVar6;
  fVar6 = sf::Time::asSeconds(&dt_local);
  io->DeltaTime = fVar6;
  if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x38) == '\x01') {
    if (io->WantSetMousePos == true) {
      local_28.y = (int)(io->MousePos).y;
      local_28.x = (int)(io->MousePos).x;
      sf::Mouse::setPosition(&local_28);
    }
    else {
      IVar1.y = (float)(*mousePos).y;
      IVar1.x = (float)(*mousePos).x;
      io->MousePos = IVar1;
    }
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      bVar4 = true;
      if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x44 + lVar5) == '\0') {
        bVar3 = sf::Touch::isDown((Button)lVar5);
        if ((!bVar3) && (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x3a + lVar5) == '\0'))
        {
          bVar4 = sf::Mouse::isButtonPressed((Button)lVar5);
        }
      }
      lVar2 = (anonymous_namespace)::s_currWindowCtx;
      io->MouseDown[lVar5] = bVar4;
      *(undefined1 *)(lVar2 + 0x3a + lVar5) = 0;
      *(undefined1 *)(lVar2 + 0x44 + lVar5) = 0;
    }
  }
  if ((io->Fonts->Fonts).Size < 1) {
    __assert_fail("io.Fonts->Fonts.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x1e8,
                  "void ImGui::SFML::Update(const sf::Vector2i &, const sf::Vector2f &, sf::Time)");
  }
  if (((io->ConfigFlags & 2) != 0) && (*(int *)((anonymous_namespace)::s_currWindowCtx + 0x50) != 8)
     ) {
    anon_unknown.dwarf_115aec::updateJoystickActionState(io,ImGuiNavInput_Activate);
    anon_unknown.dwarf_115aec::updateJoystickActionState(io,ImGuiNavInput_Cancel);
    anon_unknown.dwarf_115aec::updateJoystickActionState(io,ImGuiNavInput_Input);
    anon_unknown.dwarf_115aec::updateJoystickActionState(io,ImGuiNavInput_Menu);
    anon_unknown.dwarf_115aec::updateJoystickActionState(io,ImGuiNavInput_FocusPrev);
    anon_unknown.dwarf_115aec::updateJoystickActionState(io,ImGuiNavInput_FocusNext);
    anon_unknown.dwarf_115aec::updateJoystickActionState(io,ImGuiNavInput_TweakSlow);
    anon_unknown.dwarf_115aec::updateJoystickActionState(io,ImGuiNavInput_TweakFast);
    fVar6 = sf::Joystick::getAxisPosition
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(Axis *)((anonymous_namespace)::s_currWindowCtx + 0xa4));
    if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0xac) != '\0') {
      fVar6 = -fVar6;
    }
    fVar7 = sf::Joystick::getAxisPosition
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(Axis *)((anonymous_namespace)::s_currWindowCtx + 0xa8));
    lVar5 = (anonymous_namespace)::s_currWindowCtx;
    if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0xad) != '\0') {
      fVar7 = -fVar7;
    }
    io->NavInputs[4] =
         (float)(-(uint)(fVar6 < -*(float *)((anonymous_namespace)::s_currWindowCtx + 0xb0)) &
                0x3f800000);
    io->NavInputs[5] = (float)(-(uint)(*(float *)(lVar5 + 0xb0) < fVar6) & 0x3f800000);
    io->NavInputs[6] = (float)(-(uint)(fVar7 < -*(float *)(lVar5 + 0xb0)) & 0x3f800000);
    io->NavInputs[7] = (float)(-(uint)(*(float *)(lVar5 + 0xb0) < fVar7) & 0x3f800000);
    fVar6 = sf::Joystick::getAxisPosition(*(uint *)(lVar5 + 0x50),*(Axis *)(lVar5 + 0xb4));
    if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0xbc) != '\0') {
      fVar6 = -fVar6;
    }
    fVar7 = sf::Joystick::getAxisPosition
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(Axis *)((anonymous_namespace)::s_currWindowCtx + 0xb8));
    lVar5 = (anonymous_namespace)::s_currWindowCtx;
    if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0xbd) != '\0') {
      fVar7 = -fVar7;
    }
    fVar8 = *(float *)((anonymous_namespace)::s_currWindowCtx + 0xc0);
    if (fVar6 < -fVar8) {
      io->NavInputs[8] = ABS(fVar6 / 100.0);
      fVar8 = *(float *)(lVar5 + 0xc0);
    }
    if (fVar8 < fVar6) {
      io->NavInputs[9] = fVar6 / 100.0;
      fVar8 = *(float *)(lVar5 + 0xc0);
    }
    if (fVar7 < -fVar8) {
      io->NavInputs[10] = ABS(fVar7 / 100.0);
      fVar8 = *(float *)(lVar5 + 0xc0);
    }
    if (fVar8 < fVar7) {
      io->NavInputs[0xb] = fVar7 / 100.0;
    }
  }
  NewFrame();
  return;
}

Assistant:

void Update(const sf::Vector2i& mousePos, const sf::Vector2f& displaySize, sf::Time dt) {
    assert(s_currWindowCtx && "No current window is set - forgot to call ImGui::SFML::Init?");

    ImGuiIO& io = ImGui::GetIO();
    io.DisplaySize = ImVec2(displaySize.x, displaySize.y);
    io.DeltaTime = dt.asSeconds();

    if (s_currWindowCtx->windowHasFocus) {
        if (io.WantSetMousePos) {
            sf::Vector2i newMousePos(static_cast<int>(io.MousePos.x),
                                     static_cast<int>(io.MousePos.y));
            sf::Mouse::setPosition(newMousePos);
        } else {
            io.MousePos = ImVec2(static_cast<float>(mousePos.x), static_cast<float>(mousePos.y));
        }
        for (unsigned int i = 0; i < 3; i++) {
            io.MouseDown[i] = s_currWindowCtx->touchDown[i] || sf::Touch::isDown(i) ||
                              s_currWindowCtx->mousePressed[i] ||
                              sf::Mouse::isButtonPressed((sf::Mouse::Button)i);
            s_currWindowCtx->mousePressed[i] = false;
            s_currWindowCtx->touchDown[i] = false;
        }
    }

#ifdef ANDROID
#ifdef USE_JNI
    if (io.WantTextInput && !s_currWindowCtx->wantTextInput) {
        openKeyboardIME();
        s_currWindowCtx->wantTextInput = true;
    }

    if (!io.WantTextInput && s_currWindowCtx->wantTextInput) {
        closeKeyboardIME();
        s_currWindowCtx->wantTextInput = false;
    }
#endif
#endif

    assert(io.Fonts->Fonts.Size > 0); // You forgot to create and set up font
                                      // atlas (see createFontTexture)

    // gamepad navigation
    if ((io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) &&
        s_currWindowCtx->joystickId != NULL_JOYSTICK_ID) {
        updateJoystickActionState(io, ImGuiNavInput_Activate);
        updateJoystickActionState(io, ImGuiNavInput_Cancel);
        updateJoystickActionState(io, ImGuiNavInput_Input);
        updateJoystickActionState(io, ImGuiNavInput_Menu);

        updateJoystickActionState(io, ImGuiNavInput_FocusPrev);
        updateJoystickActionState(io, ImGuiNavInput_FocusNext);

        updateJoystickActionState(io, ImGuiNavInput_TweakSlow);
        updateJoystickActionState(io, ImGuiNavInput_TweakFast);

        updateJoystickDPadState(io);
        updateJoystickLStickState(io);
    }

    ImGui::NewFrame();
}